

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.cpp
# Opt level: O0

void __thiscall si9ma::TreeNode::~TreeNode(TreeNode *this)

{
  ostream *poVar1;
  TreeNode *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"destroy TreeNode(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->value);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

TreeNode::~TreeNode() {
        cout << "destroy TreeNode(" << value << ")" << endl;
    }